

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::Message,google::protobuf::internal::InternalMetadataWithArena>
          (ExtensionSet *this,char *ptr,Message *containing_type,InternalMetadataWithArena *metadata
          ,ParseContext *ctx)

{
  byte bVar1;
  DescriptorPool *pDVar2;
  MessageFactory *pMVar3;
  StringPiece flat;
  _Alloc_hider _Var4;
  bool bVar5;
  uint uVar6;
  MessageLite *pMVar8;
  string *psVar9;
  int iVar7;
  char *pcVar10;
  undefined4 extraout_var;
  uint uVar11;
  long lVar12;
  uint uVar13;
  undefined8 extraout_RDX;
  uint field_number;
  ushort *puVar14;
  UnknownFieldSet *this_00;
  ulong uVar15;
  ulong unaff_R15;
  bool bVar16;
  pair<const_char_*,_int> pVar17;
  pair<const_char_*,_unsigned_int> pVar18;
  pair<const_char_*,_bool> pVar19;
  bool was_packed_on_wire;
  string payload;
  ExtensionInfo extension;
  GeneratedExtensionFinder finder;
  bool local_111;
  ushort *local_110;
  ExtensionSet *local_108;
  DescriptorPool *local_100;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *local_f8;
  string local_f0;
  undefined **local_d0;
  size_type local_c8;
  ExtensionInfo local_c0;
  EpsCopyInputStream local_a0;
  int local_48;
  undefined4 local_44;
  DescriptorPool *local_40;
  MessageFactory *pMStack_38;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_d0 = &PTR__ExtensionFinder_0062da70;
  field_number = 0;
  local_108 = this;
  local_100 = (DescriptorPool *)containing_type;
  local_f8 = &metadata->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  ;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar19._8_8_ = 0;
      pVar19.first = ptr;
    }
    else {
      pVar19._8_8_ = 1;
      pVar19.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar19 = EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    puVar14 = (ushort *)pVar19.first;
    if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
    ptr = (char *)((long)puVar14 + 1);
    uVar15 = unaff_R15;
    if ((byte)*puVar14 == 0x1a) {
      if (field_number == 0) {
        bVar1 = *ptr;
        if ((char)bVar1 < '\0') {
          pVar17 = ReadSizeFallback(ptr,(uint)bVar1);
        }
        else {
          pVar17.second._0_1_ = bVar1;
          pVar17.first = (char *)(puVar14 + 1);
          pVar17._9_7_ = 0;
        }
        field_number = 0;
        if (pVar17.first == (char *)0x0) {
          bVar5 = false;
          local_110 = (ushort *)0x0;
        }
        else {
          pcVar10 = EpsCopyInputStream::ReadString
                              (&ctx->super_EpsCopyInputStream,pVar17.first,pVar17.second,&local_f0);
          pVar17._8_8_ = extraout_RDX;
          pVar17.first = pcVar10;
          bVar5 = pcVar10 != (char *)0x0;
          if (!bVar5) {
            local_110 = (ushort *)0x0;
          }
        }
        ptr = pVar17.first;
        bVar16 = false;
        if (bVar5) goto LAB_00301b60;
      }
      else {
        ptr = ParseField(local_108,(ulong)field_number * 8 + 2,ptr,(Message *)local_100,metadata,ctx
                        );
        if ((ushort *)ptr != (ushort *)0x0) {
          field_number = 0;
          goto LAB_00301b60;
        }
LAB_00301a6d:
        bVar16 = false;
        local_110 = (ushort *)0x0;
      }
    }
    else if ((byte)*puVar14 == 0x10) {
      uVar11 = (uint)(char)*(ushort *)ptr;
      uVar6 = *(ushort *)ptr + uVar11;
      uVar13 = uVar11 * 2 & uVar6;
      uVar15 = (ulong)(uVar13 >> 1);
      if ((short)uVar13 < 0) {
        puVar14 = (ushort *)((long)puVar14 + 3);
        lVar12 = 0xd;
        do {
          uVar11 = (uint)(char)*puVar14;
          uVar6 = *puVar14 + uVar11;
          uVar13 = uVar11 * 2 & uVar6;
          uVar15 = ((ulong)uVar13 - 2 << ((byte)lVar12 & 0x3f)) + uVar15;
          if (-1 < (short)uVar13) {
            ptr = (char *)((long)puVar14 + (ulong)(uVar6 < uVar11) + 1);
            goto LAB_003017ef;
          }
          lVar12 = lVar12 + 0xe;
          puVar14 = puVar14 + 1;
        } while (lVar12 != 0x45);
        ptr = (char *)0x0;
        uVar15 = unaff_R15;
      }
      else {
        ptr = (char *)((long)puVar14 + (ulong)(uVar6 < uVar11) + 2);
      }
LAB_003017ef:
      if ((ushort *)ptr == (ushort *)0x0) {
        bVar5 = false;
        local_110 = (ushort *)0x0;
      }
      else {
        field_number = (uint)uVar15;
        if (local_f0._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          pDVar2 = (ctx->data_).pool;
          if (pDVar2 == (DescriptorPool *)0x0) {
            local_a0.limit_end_ = (char *)local_d0;
            local_a0.buffer_end_ = (char *)local_100;
            bVar5 = FindExtensionInfoFromFieldNumber
                              (local_108,2,field_number,(ExtensionFinder *)&local_a0,&local_c0,
                               &local_111);
          }
          else {
            pMVar3 = (ctx->data_).factory;
            local_a0._24_8_ =
                 (**(code **)((long)&local_100->mutex_[4].mu_.super___mutex_base._M_mutex + 8))();
            local_a0.limit_end_ = (char *)&PTR__ExtensionFinder_0062fcc0;
            local_a0.buffer_end_ = (char *)pDVar2;
            local_a0.next_chunk_ = (char *)pMVar3;
            bVar5 = FindExtensionInfoFromFieldNumber
                              (local_108,2,field_number,(ExtensionFinder *)&local_a0,&local_c0,
                               &local_111);
          }
          ExtensionFinder::~ExtensionFinder((ExtensionFinder *)&local_a0);
          _Var4._M_p = local_f0._M_dataplus._M_p;
          if (bVar5 == false) {
            local_c8 = local_f0._M_string_length;
            if (((ulong)local_f8->ptr_ & 1) == 0) {
              this_00 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        ::mutable_unknown_fields_slow(local_f8);
            }
            else {
              this_00 = (UnknownFieldSet *)((ulong)local_f8->ptr_ & 0xfffffffffffffffe);
            }
            psVar9 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_00,field_number);
            field_number = 0;
            bVar5 = true;
            std::__cxx11::string::_M_replace
                      ((ulong)psVar9,0,(char *)psVar9->_M_string_length,(ulong)_Var4._M_p);
            metadata = (InternalMetadataWithArena *)local_f8;
          }
          else {
            if (local_c0.is_repeated == false) {
              pMVar8 = MutableMessage(local_108,field_number,'\v',
                                      (MessageLite *)local_c0.field_3.enum_validity_check.func,
                                      local_c0.descriptor);
            }
            else {
              pMVar8 = AddMessage(local_108,field_number,'\v',
                                  (MessageLite *)local_c0.field_3.enum_validity_check.func,
                                  local_c0.descriptor);
            }
            local_48 = ctx->depth_;
            local_a0.buffer_[0x18] = '\0';
            local_a0.buffer_[0x19] = '\0';
            local_a0.buffer_[0x1a] = '\0';
            local_a0.buffer_[0x1b] = '\0';
            local_a0.buffer_[0x1c] = '\0';
            local_a0.buffer_[0x1d] = '\0';
            local_a0.buffer_[0x1e] = '\0';
            local_a0.buffer_[0x1f] = '\0';
            local_a0.aliasing_ = 0;
            local_a0.buffer_[8] = '\0';
            local_a0.buffer_[9] = '\0';
            local_a0.buffer_[10] = '\0';
            local_a0.buffer_[0xb] = '\0';
            local_a0.buffer_[0xc] = '\0';
            local_a0.buffer_[0xd] = '\0';
            local_a0.buffer_[0xe] = '\0';
            local_a0.buffer_[0xf] = '\0';
            local_a0.buffer_[0x10] = '\0';
            local_a0.buffer_[0x11] = '\0';
            local_a0.buffer_[0x12] = '\0';
            local_a0.buffer_[0x13] = '\0';
            local_a0.buffer_[0x14] = '\0';
            local_a0.buffer_[0x15] = '\0';
            local_a0.buffer_[0x16] = '\0';
            local_a0.buffer_[0x17] = '\0';
            local_a0.zcis_ = (ZeroCopyInputStream *)0x0;
            local_a0.buffer_[0] = '\0';
            local_a0.buffer_[1] = '\0';
            local_a0.buffer_[2] = '\0';
            local_a0.buffer_[3] = '\0';
            local_a0.buffer_[4] = '\0';
            local_a0.buffer_[5] = '\0';
            local_a0.buffer_[6] = '\0';
            local_a0.buffer_[7] = '\0';
            local_a0.last_tag_minus_1_ = 0;
            local_a0.overall_limit_ = 0x7fffffff;
            local_44 = 0x80000000;
            local_40 = (DescriptorPool *)0x0;
            pMStack_38 = (MessageFactory *)0x0;
            flat.length_ = local_f0._M_string_length;
            flat.ptr_ = local_f0._M_dataplus._M_p;
            pcVar10 = EpsCopyInputStream::InitFrom(&local_a0,flat);
            local_40 = (ctx->data_).pool;
            pMStack_38 = (ctx->data_).factory;
            iVar7 = (*pMVar8->_vptr_MessageLite[0xd])(pMVar8,pcVar10,&local_a0);
            bVar16 = CONCAT44(extraout_var,iVar7) != 0;
            bVar5 = local_a0.last_tag_minus_1_ == 0 && bVar16;
            metadata = (InternalMetadataWithArena *)local_f8;
            if (local_a0.last_tag_minus_1_ == 0 && bVar16) {
              field_number = 0;
            }
            else {
              local_110 = (ushort *)0x0;
            }
          }
        }
      }
      if (bVar5) {
LAB_00301b60:
        bVar16 = true;
        unaff_R15 = uVar15;
      }
      else {
        bVar16 = false;
        unaff_R15 = uVar15;
      }
    }
    else {
      bVar1 = (byte)*puVar14;
      uVar6 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar6 = ((uint)bVar1 + (uint)(byte)*ptr * 0x80) - 0x80;
        if (*ptr < '\0') {
          pVar18 = ReadTagFallback((char *)puVar14,uVar6);
          uVar6 = pVar18.second;
          ptr = pVar18.first;
        }
        else {
          ptr = (char *)(puVar14 + 1);
        }
      }
      if (uVar6 != 0 && (uVar6 & 7) != 4) {
        ptr = ParseField(local_108,(ulong)uVar6,ptr,(Message *)local_100,metadata,ctx);
        if ((ushort *)ptr == (ushort *)0x0) goto LAB_00301a6d;
        goto LAB_00301b60;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
      bVar16 = false;
      local_110 = (ushort *)ptr;
    }
    puVar14 = local_110;
  } while (bVar16);
  local_110 = puVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return (char *)local_110;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(const char* ptr,
                                                  const Msg* containing_type,
                                                  Metadata* metadata,
                                                  internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}